

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_ObjComputePathD(Acb_Ntk_t *p,int iObj)

{
  uint iObj_00;
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int local_40;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if ((p->vObjType).pArray[(uint)iObj] == '\x03') {
    __assert_fail("!Acb_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                  ,0x138,"int Acb_ObjComputePathD(Acb_Ntk_t *, int)");
  }
  if ((p->vObjFans).nSize <= iObj) {
LAB_003ab047:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = (p->vObjFans).pArray[(uint)iObj];
  lVar3 = (long)iVar2;
  if ((lVar3 < 0) || ((p->vFanSto).nSize <= iVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar1 = (p->vFanSto).pArray;
  if (piVar1[lVar3] < 1) {
    local_40 = 0;
  }
  else {
    lVar4 = 0;
    local_40 = 0;
    do {
      iObj_00 = piVar1[lVar3 + lVar4 + 1];
      iVar2 = Acb_ObjSlack(p,iObj_00);
      if (iVar2 == 0) {
        if ((int)iObj_00 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x115,"int Acb_ObjPathD(Acb_Ntk_t *, int)");
        }
        if ((p->vPathD).nSize <= (int)iObj_00) goto LAB_003ab047;
        local_40 = local_40 + (p->vPathD).pArray[iObj_00];
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < piVar1[lVar3]);
  }
  if ((p->vPathD).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (p->vPathD).pArray[(uint)iObj] = local_40;
  return local_40;
}

Assistant:

int Acb_ObjComputePathD( Acb_Ntk_t * p, int iObj )
{
    int * pFanins, iFanin, k, Path = 0;
    assert( !Acb_ObjIsCi(p, iObj) );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        if ( !Acb_ObjSlack(p, iFanin) )
            Path += Acb_ObjPathD(p, iFanin);
    return Acb_ObjSetPathD( p, iObj, Path );
}